

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_entityValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  
  if (ptr < end) {
    if (end == ptr || (long)end - (long)ptr < 0) {
      iVar2 = -1;
    }
    else {
      for (pbVar3 = (byte *)ptr; (byte *)end != pbVar3 && -1 < (long)end - (long)pbVar3;
          pbVar3 = pbVar3 + lVar5) {
        cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar3);
        lVar5 = 2;
        switch(cVar1) {
        case '\x03':
          if (pbVar3 == (byte *)ptr) {
            iVar2 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
            return iVar2;
          }
          goto LAB_0038cae1;
        case '\x04':
        case '\b':
          goto switchD_0038ca6e_caseD_4;
        case '\x05':
          break;
        case '\x06':
          lVar5 = 3;
          break;
        case '\a':
          lVar5 = 4;
          break;
        case '\t':
          if (pbVar3 == (byte *)ptr) {
            pcVar4 = ptr + 1;
            if (end != pcVar4 && -1 < (long)end - (long)pcVar4) {
              if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
                pcVar4 = ptr + 2;
              }
              *nextTokPtr = pcVar4;
              return 7;
            }
            return -3;
          }
          goto LAB_0038cae1;
        case '\n':
          if (pbVar3 == (byte *)ptr) {
            *nextTokPtr = ptr + 1;
            return 7;
          }
          goto LAB_0038cae1;
        default:
          if (cVar1 == '\x1e') {
            if (pbVar3 == (byte *)ptr) {
              iVar2 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
              if (iVar2 != 0x16) {
                return iVar2;
              }
              return 0;
            }
            goto LAB_0038cae1;
          }
switchD_0038ca6e_caseD_4:
          lVar5 = 1;
        }
      }
LAB_0038cae1:
      *nextTokPtr = (char *)pbVar3;
      iVar2 = 6;
    }
  }
  else {
    iVar2 = -4;
  }
  return iVar2;
}

Assistant:

static int PTRCALL
PREFIX(entityValueTok)(const ENCODING *enc, const char *ptr,
                       const char *end, const char **nextTokPtr)
{
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end)) {
    /* This line cannot be executed.  The incoming data has already
     * been tokenized once, so incomplete characters like this have
     * already been eliminated from the input.  Retaining the paranoia
     * check is still valuable, however.
     */
    return XML_TOK_PARTIAL; /* LCOV_EXCL_LINE */
  }
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_PERCNT:
      if (ptr == start) {
        int tok =  PREFIX(scanPercent)(enc, ptr + MINBPC(enc),
                                       end, nextTokPtr);
        return (tok == XML_TOK_PERCENT) ? XML_TOK_INVALID : tok;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}